

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

int __thiscall
QAnimationGroup::indexOfAnimation(QAnimationGroup *this,QAbstractAnimation *animation)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  int iVar5;
  long lVar7;
  long lVar6;
  
  lVar6 = *(long *)(this + 8);
  plVar1 = (long *)(lVar6 + 0xb0);
  if (*plVar1 != 0) {
    plVar2 = (long *)(lVar6 + 0xa8);
    lVar7 = -8;
    do {
      iVar5 = (int)lVar6;
      lVar3 = *plVar1 * -8 + lVar7;
      if (lVar3 == -8) goto LAB_003b3419;
      lVar6 = lVar7 + 8;
      plVar4 = (long *)(*plVar2 + 8 + lVar7);
      lVar7 = lVar6;
    } while ((QAbstractAnimation *)*plVar4 != animation);
    iVar5 = (int)(lVar6 >> 3);
LAB_003b3419:
    if (lVar3 != -8) {
      return iVar5;
    }
  }
  return -1;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }